

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_gl.cpp
# Opt level: O0

DWORD __thiscall
FNodeBuilder::CheckLoopStart(FNodeBuilder *this,fixed_t dx,fixed_t dy,int vertex,int vertex2)

{
  int iVar1;
  angle_t aVar2;
  angle_t aVar3;
  uint uVar4;
  int iVar5;
  FPrivVert *pFVar6;
  FPrivSeg *pFVar7;
  FPrivVert *pFVar8;
  angle_t diff_1;
  angle_t segAngle_1;
  FPrivSeg *seg_1;
  angle_t diff;
  angle_t segAngle;
  FPrivSeg *seg;
  DWORD bestseg;
  angle_t bestang;
  DWORD segnum;
  angle_t splitAngle;
  FPrivVert *v;
  int vertex2_local;
  int vertex_local;
  fixed_t dy_local;
  fixed_t dx_local;
  FNodeBuilder *this_local;
  
  pFVar6 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                     (&this->Vertices,(long)vertex);
  aVar2 = PointToAngle(dx,dy);
  bestseg = pFVar6->segs2;
  seg._4_4_ = 0xffffffff;
  seg._0_4_ = 0xffffffff;
  do {
    if (bestseg == 0xffffffff) {
      if ((DWORD)seg == 0xffffffff) {
        this_local._4_4_ = 0xffffffff;
      }
      else {
        bestseg = pFVar6->segs;
        while (bestseg != 0xffffffff) {
          pFVar7 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                             (&this->Segs,(ulong)bestseg);
          if (pFVar7->v2 == vertex2) {
            return 0xffffffff;
          }
          pFVar8 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                             (&this->Vertices,(long)pFVar7->v2);
          iVar5 = (pFVar8->super_FSimpleVert).x;
          iVar1 = (pFVar6->super_FSimpleVert).x;
          pFVar8 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                             (&this->Vertices,(long)pFVar7->v2);
          aVar3 = PointToAngle(iVar5 - iVar1,
                               (pFVar8->super_FSimpleVert).y - (pFVar6->super_FSimpleVert).y);
          if ((aVar2 - aVar3 < seg._4_4_) && (pFVar7->partner != (DWORD)seg)) {
            return 0xffffffff;
          }
          bestseg = pFVar7->nextforvert;
        }
        this_local._4_4_ = (DWORD)seg;
      }
      return this_local._4_4_;
    }
    pFVar7 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(ulong)bestseg);
    pFVar8 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)pFVar7->v1);
    iVar5 = (pFVar8->super_FSimpleVert).x;
    iVar1 = (pFVar6->super_FSimpleVert).x;
    pFVar8 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)pFVar7->v1);
    aVar3 = PointToAngle(iVar5 - iVar1,(pFVar8->super_FSimpleVert).y - (pFVar6->super_FSimpleVert).y
                        );
    uVar4 = aVar2 - aVar3;
    if (uVar4 < 5000) {
      pFVar8 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                         (&this->Vertices,(long)pFVar7->v1);
      iVar5 = (pFVar8->super_FSimpleVert).x;
      pFVar8 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                         (&this->Vertices,(long)pFVar7->v1);
      iVar5 = PointOnSide(iVar5,(pFVar8->super_FSimpleVert).y,(pFVar6->super_FSimpleVert).x,
                          (pFVar6->super_FSimpleVert).y,dx,dy);
      if (iVar5 != 0) goto LAB_005fcc96;
    }
    else {
LAB_005fcc96:
      if (uVar4 <= seg._4_4_) {
        seg._0_4_ = bestseg;
        seg._4_4_ = uVar4;
      }
    }
    bestseg = pFVar7->nextforvert2;
  } while( true );
}

Assistant:

DWORD FNodeBuilder::CheckLoopStart (fixed_t dx, fixed_t dy, int vertex, int vertex2)
{
	FPrivVert *v = &Vertices[vertex];
	angle_t splitAngle = PointToAngle (dx, dy);
	DWORD segnum;
	angle_t bestang;
	DWORD bestseg;

	// Find the seg ending at this vertex that forms the smallest angle
	// to the splitter.
	segnum = v->segs2;
	bestang = ANGLE_MAX;
	bestseg = DWORD_MAX;
	while (segnum != DWORD_MAX)
	{
		FPrivSeg *seg = &Segs[segnum];
		angle_t segAngle = PointToAngle (Vertices[seg->v1].x - v->x, Vertices[seg->v1].y - v->y);
		angle_t diff = splitAngle - segAngle;

		if (diff < ANGLE_EPSILON &&
			PointOnSide (Vertices[seg->v1].x, Vertices[seg->v1].y, v->x, v->y, dx, dy) == 0)
		{
			// If a seg lies right on the splitter, don't count it
		}
		else
		{
			if (diff <= bestang)
			{
				bestang = diff;
				bestseg = segnum;
			}
		}
		segnum = seg->nextforvert2;
	}
	if (bestseg == DWORD_MAX)
	{
		return DWORD_MAX;
	}
	// Now make sure there are no segs starting at this vertex that form
	// an even smaller angle to the splitter.
	segnum = v->segs;
	while (segnum != DWORD_MAX)
	{
		FPrivSeg *seg = &Segs[segnum];
		if (seg->v2 == vertex2)
		{
			return DWORD_MAX;
		}
		angle_t segAngle = PointToAngle (Vertices[seg->v2].x - v->x, Vertices[seg->v2].y - v->y);
		angle_t diff = splitAngle - segAngle;
		if (diff < bestang && seg->partner != bestseg)
		{
			return DWORD_MAX;
		}
		segnum = seg->nextforvert;
	}
	return bestseg;
}